

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> * __thiscall
Parser::parseObjectDeclarationExpression
          (optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  ObjectDeclarationExpressionAstNode *pOVar1;
  int iVar2;
  TokenType type;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 local_108 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  undefined1 local_e8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  element_type *local_a8;
  shared_ptr<Token> key;
  vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  keyValues;
  undefined1 local_78 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> value;
  undefined1 local_58 [39];
  char local_31;
  bool error;
  
  local_31 = '\0';
  pOVar1 = (ObjectDeclarationExpressionAstNode *)(local_58 + 0x10);
  key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x39;
  local_58._0_8_ = pOVar1;
  local_58._0_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)local_58,
                  (ulong)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_58._16_8_ = key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  builtin_strncpy((char *)((long)&(((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->
                                  keyValues).
                                  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1),"ject dec",8);
  builtin_strncpy((char *)((long)&(((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->
                                  keyValues).
                                  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 1),"laration",8);
  (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->super_ExpressionAstNode).
  super_AstNode._vptr_AstNode = (_func_int **)0x6f206e6967656220;
  (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->keyValues).
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6564207463656a62;
  (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x726220796c727563;
  (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x6f742074656b6361;
  (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).super_AstNode.
  _vptr_AstNode = (_func_int **)0x6465746365707845;
  (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x207466656c206120;
  local_58._8_8_ = key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined1 *)
   ((long)&(key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base +
   (long)&((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode) = 0;
  type = (TokenType)this;
  expect((Parser *)local_108,type,(bool *)0x2,(string *)&local_31);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  if ((ObjectDeclarationExpressionAstNode *)local_58._0_8_ != pOVar1) {
    operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
  }
  key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)local_58);
    iVar2 = *(int *)&(((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->
                     super_ExpressionAstNode).super_AstNode._vptr_AstNode;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if (iVar2 == 1) {
      local_78 = (undefined1  [8])0x38;
      local_58._0_8_ = pOVar1;
      local_58._0_8_ = std::__cxx11::string::_M_create((ulong *)local_58,(ulong)local_78);
      local_58._16_8_ = local_78;
      (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->super_ExpressionAstNode).
      super_AstNode._vptr_AstNode = (_func_int **)0x626f20646e65206f;
      (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x636564207463656a;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6220796c72756320;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x742074656b636172;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).
      super_AstNode._vptr_AstNode = (_func_int **)0x6465746365707845;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7468676972206120;
      (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6e6f69746172616c;
      local_58._8_8_ = local_78;
      *(undefined1 *)
       ((long)&(((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).
               super_AstNode._vptr_AstNode + (long)local_78) = 0;
      expect((Parser *)(local_108 + 0x10),type,(bool *)0x3,(string *)&local_31);
      if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
      }
      if ((ObjectDeclarationExpressionAstNode *)local_58._0_8_ != pOVar1) {
        operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
      }
      goto LAB_0010bd15;
    }
    TokenBuffer::currentToken((TokenBuffer *)local_58);
    iVar2 = *(int *)&(((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->
                     super_ExpressionAstNode).super_AstNode._vptr_AstNode;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if (iVar2 == 3) break;
    local_78 = (undefined1  [8])0x37;
    local_58._0_8_ = pOVar1;
    local_58._0_8_ = std::__cxx11::string::_M_create((ulong *)local_58,(ulong)local_78);
    local_58._16_8_ = local_78;
    (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->super_ExpressionAstNode).
    super_AstNode._vptr_AstNode = (_func_int **)0x636e756620666f20;
    (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->keyValues).
    super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x666564206e6f6974;
    (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
    super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x7020736120726569;
    (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
    super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x726574656d617261;
    (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).super_AstNode.
    _vptr_AstNode = (_func_int **)0x6465746365707845;
    (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
    super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6669746e65646920;
    *(undefined8 *)
     ((long)&(((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->keyValues).
             super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 7) = 0x6e6f6974696e6966;
    local_58._8_8_ = local_78;
    *(undefined1 *)
     ((long)&(((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).
             super_AstNode._vptr_AstNode + (long)local_78) = 0;
    expect((Parser *)&stack0xffffffffffffff58,type,(bool *)0x18,(string *)&local_31);
    if ((ObjectDeclarationExpressionAstNode *)local_58._0_8_ != pOVar1) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_List_node_base **)local_58._16_8_ + 1))
      ;
    }
    if (*(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8->tokenType)->_M_pi != 0x18
       ) {
      local_31 = '\x01';
    }
    skipWhiteSpace(this);
    local_78 = (undefined1  [8])0x2d;
    local_58._0_8_ = pOVar1;
    local_58._0_8_ = std::__cxx11::string::_M_create((ulong *)local_58,(ulong)local_78);
    local_58._16_8_ = local_78;
    builtin_strncpy((char *)((long)&(((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->
                                    keyValues).
                                    super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5),
                    "ct key a",8);
    builtin_strncpy((char *)((long)&(((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))
                                    ->super_ExpressionAstNode).super_AstNode._vptr_AstNode + 5),
                    "nd value",8);
    (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
    super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6e65657774656220;
    (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
    super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x207463656a626f20;
    (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).super_AstNode.
    _vptr_AstNode = (_func_int **)0x6465746365707845;
    (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
    super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6e6f6c6f63206120;
    local_58._8_8_ = local_78;
    *(undefined1 *)
     ((long)&(((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).
             super_AstNode._vptr_AstNode + (long)local_78) = 0;
    expect((Parser *)(local_e8 + 0x10),type,(bool *)0x17,(string *)&local_31);
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    if ((ObjectDeclarationExpressionAstNode *)local_58._0_8_ != pOVar1) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_78,this);
    if (value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01'
       ) {
      if (local_31 == '\0') {
        std::
        vector<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>,std::allocator<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>>>
        ::emplace_back<std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
                  ((vector<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>,std::allocator<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>>>
                    *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (shared_ptr<Token> *)&stack0xffffffffffffff58,
                   (shared_ptr<ExpressionAstNode> *)local_78);
      }
    }
    else {
      local_31 = '\x01';
    }
    TokenBuffer::currentToken((TokenBuffer *)local_58);
    iVar2 = *(int *)&(((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->
                     super_ExpressionAstNode).super_AstNode._vptr_AstNode;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if (iVar2 == 3) {
      value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = true;
      value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
      local_58._0_8_ = pOVar1;
      local_58._0_8_ =
           std::__cxx11::string::_M_create
                     ((ulong *)local_58,
                      (ulong)&value.
                              super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                              .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                              _M_engaged);
      local_58._16_8_ =
           value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
           super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
           super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
      (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->super_ExpressionAstNode).
      super_AstNode._vptr_AstNode = (_func_int **)0x626f20646e65206f;
      (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x636564207463656a;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6220796c72756320;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x742074656b636172;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).
      super_AstNode._vptr_AstNode = (_func_int **)0x6465746365707845;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7468676972206120;
      (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6e6f69746172616c;
      local_58._8_8_ =
           value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
           super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
           super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
      *(undefined1 *)
       ((long)&(((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).
               super_AstNode._vptr_AstNode +
       value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_) = 0;
      expect((Parser *)local_c8,type,(bool *)0x3,(string *)&local_31);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
    }
    else {
      value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = true;
      value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
      local_58._0_8_ = pOVar1;
      local_58._0_8_ =
           std::__cxx11::string::_M_create
                     ((ulong *)local_58,
                      (ulong)&value.
                              super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                              .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                              _M_engaged);
      local_58._16_8_ =
           value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
           super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
           super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
      builtin_strncpy((char *)((long)&(((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->
                                      keyValues).
                                      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                      " key-val",8);
      builtin_strncpy((char *)((long)&(((ObjectDeclarationExpressionAstNode *)
                                       (local_58._0_8_ + 0x20))->super_ExpressionAstNode).
                                      super_AstNode._vptr_AstNode + 7),"ue pairs",8);
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6e65657774656220;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x207463656a626f20;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).
      super_AstNode._vptr_AstNode = (_func_int **)0x6465746365707845;
      (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
      super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x616d6d6f63206120;
      local_58._8_8_ =
           value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
           super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
           super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
      *(undefined1 *)
       ((long)&(((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).
               super_AstNode._vptr_AstNode +
       value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_) = 0;
      expect((Parser *)(local_c8 + 0x10),type,(bool *)0x13,(string *)&local_31);
      this_00 = local_b0;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((ObjectDeclarationExpressionAstNode *)local_58._0_8_ != pOVar1) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    if ((value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
         super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ ==
         '\x01') &&
       (value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0,
       value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._M_value.
       super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar2 == 3) {
LAB_0010bd0b:
      if (local_31 == '\x01') {
LAB_0010bd15:
        (__return_storage_ptr__->
        super__Optional_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>.
        _M_engaged = false;
      }
      else {
        local_58._0_8_ = (ObjectDeclarationExpressionAstNode *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<ObjectDeclarationExpressionAstNode,std::allocator<ObjectDeclarationExpressionAstNode>,std::vector<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>,std::allocator<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>>>&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),
                   (ObjectDeclarationExpressionAstNode **)local_58,
                   (allocator<ObjectDeclarationExpressionAstNode> *)local_78,
                   (vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                    *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        (__return_storage_ptr__->
        super__Optional_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>.
        _M_payload._M_value.
        super___shared_ptr<ObjectDeclarationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_58._0_8_;
        (__return_storage_ptr__->
        super__Optional_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>.
        _M_payload._M_value.
        super___shared_ptr<ObjectDeclarationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
        (__return_storage_ptr__->
        super__Optional_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>.
        _M_engaged = true;
      }
      std::
      vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ::~vector((vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                 *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return __return_storage_ptr__;
    }
  }
  local_78 = (undefined1  [8])0x38;
  local_58._0_8_ = pOVar1;
  local_58._0_8_ = std::__cxx11::string::_M_create((ulong *)local_58,(ulong)local_78);
  local_58._16_8_ = local_78;
  (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->super_ExpressionAstNode).
  super_AstNode._vptr_AstNode = (_func_int **)0x626f20646e65206f;
  (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->keyValues).
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x636564207463656a;
  (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6220796c72756320;
  (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x742074656b636172;
  (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).super_AstNode.
  _vptr_AstNode = (_func_int **)0x6465746365707845;
  (((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->keyValues).
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7468676972206120;
  (((ObjectDeclarationExpressionAstNode *)(local_58._0_8_ + 0x20))->keyValues).
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6e6f69746172616c;
  local_58._8_8_ = local_78;
  *(undefined1 *)
   ((long)&(((ObjectDeclarationExpressionAstNode *)local_58._0_8_)->super_ExpressionAstNode).
           super_AstNode._vptr_AstNode + (long)local_78) = 0;
  expect((Parser *)local_e8,type,(bool *)0x3,(string *)&local_31);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  if ((ObjectDeclarationExpressionAstNode *)local_58._0_8_ != pOVar1) {
    operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
  }
  goto LAB_0010bd0b;
}

Assistant:

const std::optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>>
Parser::parseObjectDeclarationExpression() noexcept {
  bool error = false;
  this->expect(TokenType::LeftCurly, error,
    "Expected a left curly bracket to begin object declaration");

  std::vector<std::pair<std::shared_ptr<Token>, std::shared_ptr<ExpressionAstNode>>> keyValues;

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end object declaration");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end object declaration");
      break;
    }

    auto key = this->expect(TokenType::Identifier, error,
      "Expected identifier as parameter of function definition");

    if (key->tokenType != TokenType::Identifier) {
      error = true;
    }

    this->skipWhiteSpace();

    this->expect(TokenType::Colon, error, "Expected a colon between object key and value");

    auto value = this->parseExpression();

    if (!value) {
      error = true;
    }

    if (!error) {
      keyValues.emplace_back(key, value.value());
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end object declaration");
      break;
    }

    this->expect(TokenType::Comma, error, "Expected a comma between object key-value pairs");
  }

  if (error) { return std::nullopt; }

  return std::make_shared<ObjectDeclarationExpressionAstNode>(keyValues);
}